

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  float *pfVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      pfVar3 = this->ptr;
      sVar5 = 0;
      do {
        ((float *)CONCAT44(extraout_var,iVar4))[sVar5] = pfVar3[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 2,4);
    this->nAlloc = n;
    this->ptr = (float *)CONCAT44(extraout_var,iVar4);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }